

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O2

void __thiscall
gmlc::libguarded::
rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
::rcu_guard::rcu_read_lock
          (rcu_guard *this,
          rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
          *list)

{
  bool bVar1;
  zombie_list_node *pzVar2;
  zombie_list_node *oldNext;
  
  this->m_list = list;
  pzVar2 = MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
           ::allocate(&list->m_zombie_alloc,1);
  this->m_zombie = pzVar2;
  (pzVar2->next)._M_b._M_p = (__pointer_type)0x0;
  (pzVar2->owner)._M_b._M_p = this;
  pzVar2->zombie_node = (node *)0x0;
  oldNext = (list->m_zombie_head)._M_b._M_p;
  do {
    (this->m_zombie->next)._M_b._M_p = oldNext;
    bVar1 = std::
            atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
            ::compare_exchange_weak
                      (&list->m_zombie_head,&oldNext,this->m_zombie,memory_order_seq_cst);
  } while (!bVar1);
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::rcu_guard::rcu_read_lock(
    const rcu_list<T, M, Alloc>& list)

{
    m_list = &list;
    m_zombie = zombie_alloc_trait::allocate(list.m_zombie_alloc, 1);
    zombie_alloc_trait::construct(list.m_zombie_alloc, m_zombie, this);
    zombie_list_node* oldNext =
        list.m_zombie_head.load(std::memory_order_relaxed);

    do {
        m_zombie->next.store(oldNext, std::memory_order_relaxed);
    } while (!list.m_zombie_head.compare_exchange_weak(oldNext, m_zombie));
}